

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void test_fun_obj(void)

{
  test_context context;
  test_context context_00;
  test_context context_01;
  test_context context_02;
  test_context context_03;
  test_context context_04;
  test_context context_05;
  test_context context_06;
  test_context context_07;
  test_context context_08;
  test_context context_09;
  test_context context_10;
  test_context context_11;
  test_context context_12;
  test_context context_13;
  test_context context_14;
  test_context context_15;
  test_context context_16;
  test_context context_17;
  bool bVar1;
  int iVar2;
  int local_800 [2];
  test_context local_7f8;
  test_scope local_7d9;
  test_context local_7d8;
  test_scope local_7b9;
  char *local_7b8;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  char *local_7a8;
  int local_7a0;
  conv_from<int,_false> local_79c;
  conv_from<int,_false> local_798;
  undefined4 local_794;
  conv_from<int,_false> constexpr_611;
  conv_from<int,_false> local_78c;
  test_context local_788;
  test_scope local_769;
  char *local_768;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  char *local_758;
  int local_750;
  conv_from<int,_true> local_74c;
  conv_from<int,_true> local_748;
  undefined4 local_744;
  conv_from<int,_true> constexpr_609;
  conv_from<int,_true> local_73c;
  test_context local_738;
  test_scope local_719;
  char *local_718;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  char *local_708;
  conv_to<int,_false> local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  int constexpr_607;
  undefined4 local_6f0;
  int local_6ec;
  test_context local_6e8;
  test_scope local_6c9;
  char *local_6c8;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  char *local_6b8;
  conv_to<int,_true> local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  int constexpr_605;
  undefined4 local_6a0;
  int local_69c;
  test_context local_698;
  test_scope local_679;
  char *local_678;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  char *local_668;
  int local_65c [3];
  int constexpr_602;
  int local_64c;
  test_context local_648;
  test_scope local_629;
  _func_int_int *local_628;
  _func_int_int *f_1;
  undefined4 uStack_618;
  undefined4 uStack_614;
  char *local_610;
  int local_604 [3];
  int constexpr_588;
  int local_5f4;
  test_context local_5f0;
  test_scope local_5d1;
  char *local_5d0;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  char *local_5c0;
  int local_5b4 [3];
  int constexpr_586;
  int local_5a4;
  test_context local_5a0;
  test_scope local_585;
  int local_584;
  test_context local_580;
  test_scope local_565;
  int local_564;
  test_context local_560;
  test_scope local_543;
  Fncr local_542;
  Fncr local_541;
  Fncr cfcr;
  char *pcStack_540;
  Fncr fcr;
  undefined4 uStack_534;
  int local_524 [3];
  int constexpr_571;
  int local_514;
  test_context local_510;
  test_scope local_4f1;
  char *local_4f0;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  char *local_4e0;
  int local_4d4 [3];
  int constexpr_569;
  int local_4c4;
  test_context local_4c0;
  test_scope local_4a1;
  char *local_4a0;
  undefined4 uStack_498;
  undefined4 uStack_494;
  char *local_490;
  int local_484 [3];
  int constexpr_567;
  int local_474;
  test_context local_470;
  test_scope local_451;
  char *local_450;
  undefined4 uStack_448;
  undefined4 uStack_444;
  char *local_440;
  int local_434 [3];
  int constexpr_565;
  int local_424;
  test_context local_420;
  test_scope local_407;
  Fncl local_406;
  Fncl local_405;
  int local_404;
  undefined1 auStack_400 [2];
  Fncl cfcl;
  Fncl fcl;
  test_scope local_3e1;
  char *local_3e0;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  char *local_3d0;
  int local_3c4 [3];
  int constexpr_551;
  int local_3b4;
  test_context local_3b0;
  test_scope local_395;
  int local_394;
  test_context local_390;
  test_scope local_375;
  int local_374;
  test_context local_370;
  test_scope local_357;
  Fnr local_356;
  Fnr local_355;
  int local_354;
  undefined1 auStack_350 [2];
  Fnr cfr;
  Fnr fr;
  test_scope local_335;
  int local_334;
  test_context local_330;
  test_scope local_315;
  int local_314;
  test_context local_310;
  test_scope local_2f1;
  char *local_2f0;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  char *local_2e0;
  int local_2d4 [3];
  int constexpr_533;
  int local_2c4;
  test_context local_2c0;
  test_scope local_2a3;
  Fnl local_2a2;
  Fnl local_2a1;
  Fnl cfl;
  char *pcStack_2a0;
  Fnl fl;
  undefined4 uStack_294;
  int local_284 [3];
  int constexpr_520;
  int local_274;
  test_context local_270;
  test_scope local_251;
  char *local_250;
  undefined4 uStack_248;
  undefined4 uStack_244;
  char *local_240;
  int local_234 [3];
  int constexpr_518;
  int local_224;
  test_context local_220;
  test_scope local_201;
  char *local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  char *local_1f0;
  int local_1e4 [3];
  int constexpr_516;
  int local_1d4;
  test_context local_1d0;
  test_scope local_1b1;
  char *local_1b0;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  char *local_1a0;
  int local_194 [3];
  int constexpr_514;
  int local_184;
  test_context local_180;
  test_scope local_167;
  Fnc local_166;
  Fnc local_165;
  int local_164;
  undefined1 auStack_160 [2];
  Fnc cfc;
  Fnc fc;
  test_scope local_141;
  int local_140 [2];
  test_context local_138;
  test_scope local_119;
  test_context local_118;
  test_scope local_fd;
  int local_fc;
  test_context local_f8;
  test_scope local_d9;
  char *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  char *local_c8;
  int local_bc [3];
  int constexpr_496;
  int local_ac;
  test_context local_a8;
  test_scope local_8d;
  int local_8c;
  test_context local_88;
  test_scope local_69;
  char *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  int local_4c [3];
  int constexpr_493;
  undefined4 local_34 [2];
  int local_2c;
  test_context local_28;
  test_scope local_b;
  Fn local_a;
  Fn local_9 [7];
  Fn cf;
  Fn f;
  
  local_9[0] = (Fn)0x0;
  local_a = (Fn)0x0;
  local_28.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_28.line = 0x1ec;
  local_28.expr = "test_invoke_fun(f(40), nothrows, f, 40)";
  test_scope::test_scope(&local_b,&local_28);
  local_2c = test_fun_obj::Fn::operator()(local_9,0x28);
  local_34[0] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fn&,int>(&local_2c,local_9,local_34);
  test_scope::~test_scope(&local_b);
  local_4c[1] = 0x28;
  local_4c[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fn&,int>(local_9,local_4c);
  local_68 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_60 = 0x1ed;
  local_58 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  context._12_4_ = uStack_5c;
  context.line = 0x1ed;
  context.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  test_check(iVar2 == 0x28,context);
  local_88.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_88.line = 0x1ee;
  local_88.expr = "test_not_invocable(cf, 40)";
  test_scope::test_scope(&local_69,&local_88);
  local_8c = 0x28;
  test_not_invocable<test_fun_obj()::Fn_const&,int>(&local_a,&local_8c);
  test_scope::~test_scope(&local_69);
  local_a8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_a8.line = 0x1ef;
  local_a8.expr = "test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40)";
  test_scope::test_scope(&local_8d,&local_a8);
  local_ac = test_fun_obj::Fn::operator()(local_9,0x28);
  local_bc[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fn,int>(&local_ac,local_9,local_bc + 2);
  test_scope::~test_scope(&local_8d);
  local_bc[1] = 0x28;
  local_bc[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fn,int>(local_9,local_bc);
  local_d8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_d0 = 0x1f0;
  local_c8 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(f), 40))";
  context_00._12_4_ = uStack_cc;
  context_00.line = 0x1f0;
  context_00.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_00.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(f), 40))";
  test_check(iVar2 == 0x28,context_00);
  local_f8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_f8.line = 0x1f1;
  local_f8.expr = "test_not_invocable(std::move(cf), 40)";
  test_scope::test_scope(&local_d9,&local_f8);
  local_fc = 0x28;
  test_not_invocable<test_fun_obj()::Fn_const,int>(&local_a,&local_fc);
  test_scope::~test_scope(&local_d9);
  local_118.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_118.line = 499;
  local_118.expr = "test_not_invocable(f)";
  test_scope::test_scope(&local_fd,&local_118);
  test_not_invocable<test_fun_obj()::Fn&>(local_9);
  test_scope::~test_scope(&local_fd);
  local_138.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_138.line = 500;
  local_138.expr = "test_not_invocable(f, 40, 41)";
  test_scope::test_scope(&local_119,&local_138);
  local_140[1] = 0x28;
  local_140[0] = 0x29;
  test_not_invocable<test_fun_obj()::Fn&,int,int>(local_9,local_140 + 1,local_140);
  test_scope::~test_scope(&local_119);
  _auStack_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  test_scope::test_scope(&local_141,(test_context *)auStack_160);
  local_164 = 0x28;
  test_not_invocable_r<int*,test_fun_obj()::Fn&,int>(local_9,&local_164);
  test_scope::~test_scope(&local_141);
  local_165 = (Fnc)0x0;
  local_166 = (Fnc)0x0;
  local_180.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_180.line = 0x201;
  local_180.expr = "test_invoke_fun(fc(40), nothrows, fc, 40)";
  test_scope::test_scope(&local_167,&local_180);
  local_184 = test_fun_obj::Fnc::operator()(&local_165,0x28);
  local_194[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fnc&,int>(&local_184,&local_165,local_194 + 2);
  test_scope::~test_scope(&local_167);
  local_194[1] = 0x29;
  local_194[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fnc&,int>(&local_165,local_194);
  local_1b0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_1a8 = 0x202;
  local_1a0 = "PP_UNIQUE(constexpr) == (eggs::invoke(fc, 40))";
  context_01._12_4_ = uStack_1a4;
  context_01.line = 0x202;
  context_01.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_01.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(fc, 40))";
  test_check(iVar2 == 0x29,context_01);
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_1d0.line = 0x203;
  local_1d0.expr = "test_invoke_fun(cfc(40), nothrows, cfc, 40)";
  test_scope::test_scope(&local_1b1,&local_1d0);
  local_1d4 = test_fun_obj::Fnc::operator()(&local_166,0x28);
  local_1e4[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fnc_const&,int>(&local_1d4,&local_166,local_1e4 + 2);
  test_scope::~test_scope(&local_1b1);
  local_1e4[1] = 0x29;
  local_1e4[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fnc_const&,int>(&local_166,local_1e4);
  local_200 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_1f8 = 0x204;
  local_1f0 = "PP_UNIQUE(constexpr) == (eggs::invoke(cfc, 40))";
  context_02._12_4_ = uStack_1f4;
  context_02.line = 0x204;
  context_02.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_02.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(cfc, 40))";
  test_check(iVar2 == 0x29,context_02);
  local_220.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_220.line = 0x205;
  local_220.expr = "test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40)";
  test_scope::test_scope(&local_201,&local_220);
  local_224 = test_fun_obj::Fnc::operator()(&local_165,0x28);
  local_234[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fnc,int>(&local_224,&local_165,local_234 + 2);
  test_scope::~test_scope(&local_201);
  local_234[1] = 0x29;
  local_234[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fnc,int>(&local_165,local_234);
  local_250 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_248 = 0x206;
  local_240 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fc), 40))";
  context_03._12_4_ = uStack_244;
  context_03.line = 0x206;
  context_03.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_03.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fc), 40))";
  test_check(iVar2 == 0x29,context_03);
  local_270.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_270.line = 0x207;
  local_270.expr = "test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40)";
  test_scope::test_scope(&local_251,&local_270);
  local_274 = test_fun_obj::Fnc::operator()(&local_166,0x28);
  local_284[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fnc_const,int>(&local_274,&local_166,local_284 + 2);
  test_scope::~test_scope(&local_251);
  local_284[1] = 0x29;
  local_284[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fnc_const,int>(&local_166,local_284);
  pcStack_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_04._12_4_ = uStack_294;
  context_04.line = 0x208;
  context_04.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_04.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfc), 40))";
  test_check(iVar2 == 0x29,context_04);
  local_2a1 = (Fnl)0x0;
  local_2a2 = (Fnl)0x0;
  local_2c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_2c0.line = 0x214;
  local_2c0.expr = "test_invoke_fun(fl(40), nothrows, fl, 40)";
  test_scope::test_scope(&local_2a3,&local_2c0);
  local_2c4 = test_fun_obj::Fnl::operator()(&local_2a1,0x28);
  local_2d4[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fnl&,int>(&local_2c4,&local_2a1,local_2d4 + 2);
  test_scope::~test_scope(&local_2a3);
  local_2d4[1] = 0x2a;
  local_2d4[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fnl&,int>(&local_2a1,local_2d4);
  local_2f0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_2e8 = 0x215;
  local_2e0 = "PP_UNIQUE(constexpr) == (eggs::invoke(fl, 40))";
  context_05._12_4_ = uStack_2e4;
  context_05.line = 0x215;
  context_05.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_05.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(fl, 40))";
  test_check(iVar2 == 0x2a,context_05);
  local_310.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_310.line = 0x216;
  local_310.expr = "test_not_invocable(cfl, 40)";
  test_scope::test_scope(&local_2f1,&local_310);
  local_314 = 0x28;
  test_not_invocable<test_fun_obj()::Fnl_const&,int>(&local_2a2,&local_314);
  test_scope::~test_scope(&local_2f1);
  local_330.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_330.line = 0x217;
  local_330.expr = "test_not_invocable(std::move(fl), 40)";
  test_scope::test_scope(&local_315,&local_330);
  local_334 = 0x28;
  test_not_invocable<test_fun_obj()::Fnl,int>(&local_2a1,&local_334);
  test_scope::~test_scope(&local_315);
  _auStack_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  test_scope::test_scope(&local_335,(test_context *)auStack_350);
  local_354 = 0x28;
  test_not_invocable<test_fun_obj()::Fnl_const,int>(&local_2a2,&local_354);
  test_scope::~test_scope(&local_335);
  local_355 = (Fnr)0x0;
  local_356 = (Fnr)0x0;
  local_370.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_370.line = 0x224;
  local_370.expr = "test_not_invocable(fr, 40)";
  test_scope::test_scope(&local_357,&local_370);
  local_374 = 0x28;
  test_not_invocable<test_fun_obj()::Fnr&,int>(&local_355,&local_374);
  test_scope::~test_scope(&local_357);
  local_390.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_390.line = 0x225;
  local_390.expr = "test_not_invocable(cfr, 40)";
  test_scope::test_scope(&local_375,&local_390);
  local_394 = 0x28;
  test_not_invocable<test_fun_obj()::Fnr_const&,int>(&local_356,&local_394);
  test_scope::~test_scope(&local_375);
  local_3b0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_3b0.line = 0x226;
  local_3b0.expr = "test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40)";
  test_scope::test_scope(&local_395,&local_3b0);
  local_3b4 = test_fun_obj::Fnr::operator()(&local_355,0x28);
  local_3c4[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fnr,int>(&local_3b4,&local_355,local_3c4 + 2);
  test_scope::~test_scope(&local_395);
  local_3c4[1] = 0x2b;
  local_3c4[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fnr,int>(&local_355,local_3c4);
  local_3e0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_3d8 = 0x227;
  local_3d0 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fr), 40))";
  context_06._12_4_ = uStack_3d4;
  context_06.line = 0x227;
  context_06.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_06.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fr), 40))";
  test_check(iVar2 == 0x2b,context_06);
  _auStack_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  test_scope::test_scope(&local_3e1,(test_context *)auStack_400);
  local_404 = 0x28;
  test_not_invocable<test_fun_obj()::Fnr_const,int>(&local_356,&local_404);
  test_scope::~test_scope(&local_3e1);
  local_405 = (Fncl)0x0;
  local_406 = (Fncl)0x0;
  local_420.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_420.line = 0x234;
  local_420.expr = "test_invoke_fun(fcl(40), nothrows, fcl, 40)";
  test_scope::test_scope(&local_407,&local_420);
  local_424 = test_fun_obj::Fncl::operator()(&local_405,0x28);
  local_434[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fncl&,int>(&local_424,&local_405,local_434 + 2);
  test_scope::~test_scope(&local_407);
  local_434[1] = 0x2c;
  local_434[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fncl&,int>(&local_405,local_434);
  local_450 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_448 = 0x235;
  local_440 = "PP_UNIQUE(constexpr) == (eggs::invoke(fcl, 40))";
  context_07._12_4_ = uStack_444;
  context_07.line = 0x235;
  context_07.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_07.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(fcl, 40))";
  test_check(iVar2 == 0x2c,context_07);
  local_470.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_470.line = 0x236;
  local_470.expr = "test_invoke_fun(cfcl(40), nothrows, cfcl, 40)";
  test_scope::test_scope(&local_451,&local_470);
  local_474 = test_fun_obj::Fncl::operator()(&local_406,0x28);
  local_484[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fncl_const&,int>(&local_474,&local_406,local_484 + 2);
  test_scope::~test_scope(&local_451);
  local_484[1] = 0x2c;
  local_484[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fncl_const&,int>(&local_406,local_484);
  local_4a0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_498 = 0x237;
  local_490 = "PP_UNIQUE(constexpr) == (eggs::invoke(cfcl, 40))";
  context_08._12_4_ = uStack_494;
  context_08.line = 0x237;
  context_08.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_08.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(cfcl, 40))";
  test_check(iVar2 == 0x2c,context_08);
  local_4c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_4c0.line = 0x238;
  local_4c0.expr = "test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40)";
  test_scope::test_scope(&local_4a1,&local_4c0);
  local_4c4 = test_fun_obj::Fncl::operator()(&local_405,0x28);
  local_4d4[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fncl,int>(&local_4c4,&local_405,local_4d4 + 2);
  test_scope::~test_scope(&local_4a1);
  local_4d4[1] = 0x2c;
  local_4d4[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fncl,int>(&local_405,local_4d4);
  local_4f0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_4e8 = 0x239;
  local_4e0 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcl), 40))";
  context_09._12_4_ = uStack_4e4;
  context_09.line = 0x239;
  context_09.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_09.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcl), 40))";
  test_check(iVar2 == 0x2c,context_09);
  local_510.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_510.line = 0x23a;
  local_510.expr = "test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40)";
  test_scope::test_scope(&local_4f1,&local_510);
  local_514 = test_fun_obj::Fncl::operator()(&local_406,0x28);
  local_524[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fncl_const,int>(&local_514,&local_406,local_524 + 2);
  test_scope::~test_scope(&local_4f1);
  local_524[1] = 0x2c;
  local_524[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fncl_const,int>(&local_406,local_524);
  pcStack_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_10._12_4_ = uStack_534;
  context_10.line = 0x23b;
  context_10.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_10.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcl), 40))";
  test_check(iVar2 == 0x2c,context_10);
  local_541 = (Fncr)0x0;
  local_542 = (Fncr)0x0;
  local_560.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_560.line = 0x247;
  local_560.expr = "test_not_invocable(fcr, 40)";
  test_scope::test_scope(&local_543,&local_560);
  local_564 = 0x28;
  test_not_invocable<test_fun_obj()::Fncr&,int>(&local_541,&local_564);
  test_scope::~test_scope(&local_543);
  local_580.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_580.line = 0x248;
  local_580.expr = "test_not_invocable(cfcr, 40)";
  test_scope::test_scope(&local_565,&local_580);
  local_584 = 0x28;
  test_not_invocable<test_fun_obj()::Fncr_const&,int>(&local_542,&local_584);
  test_scope::~test_scope(&local_565);
  local_5a0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_5a0.line = 0x249;
  local_5a0.expr = "test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40)";
  test_scope::test_scope(&local_585,&local_5a0);
  local_5a4 = test_fun_obj::Fncr::operator()(&local_541,0x28);
  local_5b4[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fncr,int>(&local_5a4,&local_541,local_5b4 + 2);
  test_scope::~test_scope(&local_585);
  local_5b4[1] = 0x2d;
  local_5b4[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fncr,int>(&local_541,local_5b4);
  local_5d0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_5c8 = 0x24a;
  local_5c0 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcr), 40))";
  context_11._12_4_ = uStack_5c4;
  context_11.line = 0x24a;
  context_11.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_11.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcr), 40))";
  test_check(iVar2 == 0x2d,context_11);
  local_5f0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_5f0.line = 0x24b;
  local_5f0.expr = "test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40)";
  test_scope::test_scope(&local_5d1,&local_5f0);
  local_5f4 = test_fun_obj::Fncr::operator()(&local_542,0x28);
  local_604[2] = 0x28;
  test_invoke_fun<int,true,test_fun_obj()::Fncr_const,int>(&local_5f4,&local_542,local_604 + 2);
  test_scope::~test_scope(&local_5d1);
  local_604[1] = 0x2d;
  local_604[0] = 0x28;
  iVar2 = eggs::invoke<test_fun_obj()::Fncr_const,int>(&local_542,local_604);
  f_1 = (_func_int_int *)anon_var_dwarf_1f59;
  uStack_618 = 0x24c;
  local_610 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcr), 40))";
  context_12._12_4_ = uStack_614;
  context_12.line = 0x24c;
  context_12.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_12.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcr), 40))";
  test_check(iVar2 == 0x2d,context_12);
  local_628 = test_fun_obj::S::f;
  local_648.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_648.line = 0x259;
  local_648.expr = "test_invoke_fun(f(40), p0012_nothrows, f, 40)";
  test_scope::test_scope(&local_629,&local_648);
  local_64c = test_fun_obj::S::f(0x28);
  local_65c[2] = 0x28;
  test_invoke_fun<int,true,int(*const&)(int)noexcept,int>(&local_64c,&local_628,local_65c + 2);
  test_scope::~test_scope(&local_629);
  local_65c[1] = 0x2e;
  local_65c[0] = 0x28;
  iVar2 = eggs::invoke<int(*const&)(int)noexcept,int>(&local_628,local_65c);
  local_678 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_670 = 0x25a;
  local_668 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  context_13._12_4_ = uStack_66c;
  context_13.line = 0x25a;
  context_13.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_13.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  test_check(iVar2 == 0x2e,context_13);
  local_698.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_698.line = 0x25c;
  local_698.expr = "test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40})";
  test_scope::test_scope(&local_679,&local_698);
  local_6a0 = 0x28;
  iVar2 = conv_to::operator_cast_to_int((conv_to *)&local_6a0);
  local_69c = test_fun_obj::S::f(iVar2);
  local_6a8 = 0x28;
  test_invoke_fun<int,true,int(*const&)(int)noexcept,conv_to<int,true>>
            (&local_69c,&local_628,&local_6a8);
  test_scope::~test_scope(&local_679);
  local_6ac = 0x2e;
  local_6b0.val = 0x28;
  iVar2 = eggs::invoke<int(*const&)(int)noexcept,conv_to<int,true>>(&local_628,&local_6b0);
  local_6c8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_6c0 = 0x25d;
  local_6b8 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to<int>{40}))";
  context_14._12_4_ = uStack_6bc;
  context_14.line = 0x25d;
  context_14.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_14.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to<int>{40}))";
  test_check(iVar2 == 0x2e,context_14);
  local_6e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_6e8.line = 0x25e;
  local_6e8.expr = "test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40})"
  ;
  test_scope::test_scope(&local_6c9,&local_6e8);
  local_6f0 = 0x28;
  iVar2 = conv_to::operator_cast_to_int((conv_to *)&local_6f0);
  local_6ec = test_fun_obj::S::f(iVar2);
  local_6f8 = 0x28;
  test_invoke_fun<int,false,int(*const&)(int)noexcept,conv_to<int,false>>
            (&local_6ec,&local_628,&local_6f8);
  test_scope::~test_scope(&local_6c9);
  local_6fc = 0x2e;
  local_700.val = 0x28;
  iVar2 = eggs::invoke<int(*const&)(int)noexcept,conv_to<int,false>>(&local_628,&local_700);
  local_718 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_710 = 0x25f;
  local_708 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to_throws<int>{40}))";
  context_15._12_4_ = uStack_70c;
  context_15.line = 0x25f;
  context_15.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_15.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to_throws<int>{40}))";
  test_check(iVar2 == 0x2e,context_15);
  local_738.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_738.line = 0x260;
  local_738.expr = "test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40)"
  ;
  test_scope::test_scope(&local_719,&local_738);
  iVar2 = test_fun_obj::S::f(0x28);
  conv_from<int,_true>::conv_from(&local_73c,iVar2);
  local_744 = 0x28;
  test_invoke_r_fun<conv_from<int,true>,true,true,int(*const&)(int)noexcept,int>
            (&local_73c,&local_628,&local_744);
  test_scope::~test_scope(&local_719);
  local_748.val = 0x2e;
  local_750 = 0x28;
  local_74c = eggs::invoke_r<conv_from<int,true>,int(*const&)(int)noexcept,int>
                        (&local_628,&local_750);
  bVar1 = conv_from<int,_true>::operator==(&local_748,&local_74c);
  local_768 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_760 = 0x261;
  local_758 = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from<int>>(f, 40))";
  context_16._12_4_ = uStack_75c;
  context_16.line = 0x261;
  context_16.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_16.expr = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from<int>>(f, 40))";
  test_check(bVar1,context_16);
  local_788.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_788.line = 0x262;
  local_788.expr = "test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40)";
  test_scope::test_scope(&local_769,&local_788);
  iVar2 = test_fun_obj::S::f(0x28);
  conv_from<int,_false>::conv_from(&local_78c,iVar2);
  local_794 = 0x28;
  test_invoke_r_fun<conv_from<int,false>,true,false,int(*const&)(int)noexcept,int>
            (&local_78c,&local_628,&local_794);
  test_scope::~test_scope(&local_769);
  local_798.val = 0x2e;
  local_7a0 = 0x28;
  local_79c = eggs::invoke_r<conv_from<int,false>,int(*const&)(int)noexcept,int>
                        (&local_628,&local_7a0);
  bVar1 = conv_from<int,_false>::operator==(&local_798,&local_79c);
  local_7b8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_7b0 = 0x263;
  local_7a8 = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from_throws<int>>(f, 40))";
  context_17._12_4_ = uStack_7ac;
  context_17.line = 0x263;
  context_17.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_17.expr = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from_throws<int>>(f, 40))";
  test_check(bVar1,context_17);
  local_7d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_7d8.line = 0x265;
  local_7d8.expr = "test_not_invocable(f)";
  test_scope::test_scope(&local_7b9,&local_7d8);
  test_not_invocable<int(*const&)(int)noexcept>(&local_628);
  test_scope::~test_scope(&local_7b9);
  local_7f8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_7f8.line = 0x266;
  local_7f8.expr = "test_not_invocable(f, 40, 41)";
  test_scope::test_scope(&local_7d9,&local_7f8);
  local_800[1] = 0x28;
  local_800[0] = 0x29;
  test_not_invocable<int(*const&)(int)noexcept,int,int>(&local_628,local_800 + 1,local_800);
  test_scope::~test_scope(&local_7d9);
  return;
}

Assistant:

void test_fun_obj()
{
    /* call-op */ {
        struct Fn
        {
            constexpr14 int operator()(int base) noexcept
            {
                return base + 0;
            }
        };
        auto f = Fn{};
        constexpr auto cf = Fn{};

        CHECK_SCOPE(test_invoke_fun(f(40), nothrows, f, 40));
        CHECK_CONSTEXPR14(eggs::invoke(f, 40));
        CHECK_SCOPE(test_not_invocable(cf, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40));
        CHECK_CONSTEXPR14(eggs::invoke(std::move(f), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cf), 40));

        CHECK_SCOPE(test_not_invocable(f));
        CHECK_SCOPE(test_not_invocable(f, 40, 41));
        CHECK_SCOPE(test_not_invocable_r<int*>(f, 40));

        struct Fnc
        {
            constexpr int operator()(int base) const noexcept
            {
                return base + 1;
            }
        };
        auto fc = Fnc{};
        constexpr auto cfc = Fnc{};

        CHECK_SCOPE(test_invoke_fun(fc(40), nothrows, fc, 40));
        CHECK_CONSTEXPR(eggs::invoke(fc, 40));
        CHECK_SCOPE(test_invoke_fun(cfc(40), nothrows, cfc, 40));
        CHECK_CONSTEXPR(eggs::invoke(cfc, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fc), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfc), 40));

        struct Fnl
        {
            constexpr14 int operator()(int base) & noexcept
            {
                return base + 2;
            }
        };
        auto fl = Fnl{};
        constexpr auto cfl = Fnl{};

        CHECK_SCOPE(test_invoke_fun(fl(40), nothrows, fl, 40));
        CHECK_CONSTEXPR14(eggs::invoke(fl, 40));
        CHECK_SCOPE(test_not_invocable(cfl, 40));
        CHECK_SCOPE(test_not_invocable(std::move(fl), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cfl), 40));

        struct Fnr
        {
            constexpr14 int operator()(int base) && noexcept
            {
                return base + 3;
            }
        };
        auto fr = Fnr{};
        constexpr auto cfr = Fnr{};

        CHECK_SCOPE(test_not_invocable(fr, 40));
        CHECK_SCOPE(test_not_invocable(cfr, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40));
        CHECK_CONSTEXPR14(eggs::invoke(std::move(fr), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cfr), 40));

        struct Fncl
        {
            constexpr int operator()(int base) const& noexcept
            {
                return base + 4;
            }
        };
        auto fcl = Fncl{};
        constexpr auto cfcl = Fncl{};

        CHECK_SCOPE(test_invoke_fun(fcl(40), nothrows, fcl, 40));
        CHECK_CONSTEXPR(eggs::invoke(fcl, 40));
        CHECK_SCOPE(test_invoke_fun(cfcl(40), nothrows, cfcl, 40));
        CHECK_CONSTEXPR(eggs::invoke(cfcl, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fcl), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfcl), 40));

        struct Fncr
        {
            constexpr int operator()(int base) const&& noexcept
            {
                return base + 5;
            }
        };
        auto fcr = Fncr{};
        constexpr auto cfcr = Fncr{};

        CHECK_SCOPE(test_not_invocable(fcr, 40));
        CHECK_SCOPE(test_not_invocable(cfcr, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fcr), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfcr), 40));
    }

    /* fun-ptr */ {
        struct S
        {
            static constexpr int f(int base) noexcept(p0012)
            {
                return base + 6;
            }
        };
        constexpr auto f = &S::f;

        CHECK_SCOPE(test_invoke_fun(f(40), p0012_nothrows, f, 40));
        CHECK_CONSTEXPR(eggs::invoke(f, 40));

        CHECK_SCOPE(test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40}));
        CHECK_CONSTEXPR(eggs::invoke(f, conv_to<int>{40}));
        CHECK_SCOPE(test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40}));
        CHECK_CONSTEXPR(eggs::invoke(f, conv_to_throws<int>{40}));
        CHECK_SCOPE(test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40));
        CHECK_CONSTEXPR(eggs::invoke_r<conv_from<int>>(f, 40));
        CHECK_SCOPE(test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40));
        CHECK_CONSTEXPR(eggs::invoke_r<conv_from_throws<int>>(f, 40));

        CHECK_SCOPE(test_not_invocable(f));
        CHECK_SCOPE(test_not_invocable(f, 40, 41));
    }
}